

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNSymBase::fold_addr_const(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  CTcSymbol *pCVar2;
  undefined4 extraout_var;
  CTcPrsSymtab *in_RSI;
  long *in_RDI;
  CTcSymbol *sym;
  CTcPrsNode *local_8;
  
  (**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  pCVar2 = CTcPrsSymtab::find(in_RSI,(textchar_t *)in_RDI,0x25aef8);
  if (pCVar2 == (CTcSymbol *)0x0) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[4])();
    local_8 = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTPNSymBase::fold_addr_const(CTcPrsSymtab *symtab)
{
    CTcSymbol *sym;

    /* look up my symbol; if we don't find it, don't define it */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* we got a symbol - ask it to do the folding */
        return sym->fold_addr_const();
    }
    else
    {
        /* undefined symbol - there's no constant address value */
        return 0;
    }
}